

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 *puVar2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar3;
  BVH *bvh;
  size_t sVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  int iVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  ulong uVar22;
  undefined4 uVar23;
  long lVar24;
  NodeRef root;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  ulong uVar31;
  ulong uVar32;
  NodeRef *pNVar33;
  bool bVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar47;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar43;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar44;
  float fVar45;
  float fVar46;
  undefined1 in_ZMM0 [64];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar63;
  undefined1 auVar59 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar60 [64];
  float fVar64;
  float fVar86;
  float fVar87;
  vint4 ai_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  float fVar96;
  float fVar97;
  vint4 ai;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  undefined1 auVar95 [16];
  float fVar99;
  float fVar110;
  float fVar111;
  vint4 ai_1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  undefined1 auVar109 [16];
  float fVar113;
  float fVar128;
  float fVar129;
  vint4 ai_3;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar130;
  undefined1 auVar127 [16];
  float fVar131;
  float fVar140;
  float fVar141;
  vint4 bi;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  undefined1 auVar139 [16];
  float fVar143;
  float fVar149;
  float fVar150;
  vint4 bi_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar152;
  float fVar160;
  float fVar161;
  vint4 bi_3;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar162;
  undefined1 auVar159 [16];
  float fVar163;
  float fVar168;
  float fVar169;
  vint4 bi_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar171;
  float fVar176;
  float fVar177;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  undefined1 auVar175 [16];
  float fVar179;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  undefined1 auVar184 [16];
  float fVar188;
  float fVar191;
  float fVar192;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar193;
  float fVar194;
  float fVar197;
  float fVar198;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  TravRayK<4,_true> tray;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1838;
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined1 local_17d8 [8];
  float fStack_17d0;
  float fStack_17cc;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar85 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar49 = vpcmpeqd_avx(auVar85,(undefined1  [16])valid_i->field_0);
    auVar65 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar65,5);
    auVar56 = auVar49 & auVar9;
    if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar56[0xf] < '\0')
    {
      auVar9 = vandps_avx(auVar9,auVar49);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar180._8_4_ = 0x7fffffff;
      auVar180._0_8_ = 0x7fffffff7fffffff;
      auVar180._12_4_ = 0x7fffffff;
      auVar49 = vandps_avx(auVar180,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar164._8_4_ = 0x219392ef;
      auVar164._0_8_ = 0x219392ef219392ef;
      auVar164._12_4_ = 0x219392ef;
      auVar56 = vcmpps_avx(auVar49,auVar164,1);
      auVar189._8_4_ = 0x3f800000;
      auVar189._0_8_ = &DAT_3f8000003f800000;
      auVar189._12_4_ = 0x3f800000;
      auVar114 = vdivps_avx(auVar189,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar49 = vandps_avx(auVar180,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar100 = vcmpps_avx(auVar49,auVar164,1);
      auVar115 = vdivps_avx(auVar189,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar49 = vandps_avx(auVar180,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar49 = vcmpps_avx(auVar49,auVar164,1);
      auVar165._8_4_ = 0x5d5e0b6b;
      auVar165._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar165._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar114,auVar165,auVar56)
      ;
      auVar56 = vdivps_avx(auVar189,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar115,auVar165,auVar100);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar56,auVar165,auVar49);
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar65,1);
      auVar114._8_4_ = 0x10;
      auVar114._0_8_ = 0x1000000010;
      auVar114._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar49,auVar114);
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar65,5);
      auVar56._8_4_ = 0x20;
      auVar56._0_8_ = 0x2000000020;
      auVar56._12_4_ = 0x20;
      auVar115._8_4_ = 0x30;
      auVar115._0_8_ = 0x3000000030;
      auVar115._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar115,auVar56,auVar49)
      ;
      auVar49 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar65,5);
      auVar100._8_4_ = 0x40;
      auVar100._0_8_ = 0x4000000040;
      auVar100._12_4_ = 0x40;
      auVar116._8_4_ = 0x50;
      auVar116._0_8_ = 0x5000000050;
      auVar116._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar116,auVar100,auVar49);
      auVar49 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar65);
      auVar56 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar65);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar206 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar49,auVar9);
      auVar60 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar49._8_4_ = 0xff800000;
      auVar49._0_8_ = 0xff800000ff800000;
      auVar49._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar49,auVar56,auVar9);
      terminated.field_0._0_4_ = auVar9._0_4_ ^ auVar85._0_4_;
      terminated.field_0._4_4_ = auVar9._4_4_ ^ auVar85._4_4_;
      terminated.field_0._8_4_ = auVar9._8_4_ ^ auVar85._8_4_;
      terminated.field_0._12_4_ = auVar9._12_4_ ^ auVar85._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 3;
      }
      else {
        uVar29 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar30 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar30 = paVar30 + -1;
        root.ptr = pNVar33[-1].ptr;
        pNVar33 = pNVar33 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0053faea:
          iVar20 = 3;
        }
        else {
          aVar3 = *paVar30;
          auVar85 = vcmpps_avx((undefined1  [16])aVar3,(undefined1  [16])tray.tfar.field_0,1);
          uVar19 = vmovmskps_avx(auVar85);
          if (uVar19 == 0) {
LAB_0053fafb:
            iVar20 = 2;
          }
          else {
            uVar32 = (ulong)(uVar19 & 0xff);
            uVar19 = POPCOUNT(uVar19 & 0xff);
            iVar20 = 0;
            if (uVar19 <= uVar29) {
              do {
                sVar4 = 0;
                for (uVar21 = uVar32; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000)
                {
                  sVar4 = sVar4 + 1;
                }
                auVar60 = ZEXT1664(auVar60._0_16_);
                bVar34 = occluded1(This,bvh,root,sVar4,&pre,ray,&tray,context);
                if (bVar34) {
                  terminated.field_0.i[sVar4] = -1;
                }
                uVar32 = uVar32 - 1 & uVar32;
              } while (uVar32 != 0);
              auVar85 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar20 = 3;
              auVar206 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar85[0xf] < '\0') {
                auVar60 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                auVar85._8_4_ = 0xff800000;
                auVar85._0_8_ = 0xff800000ff800000;
                auVar85._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar85,
                                   (undefined1  [16])terminated.field_0);
                iVar20 = 2;
              }
            }
            auVar201 = ZEXT1664((undefined1  [16])aVar3);
            if (uVar29 < uVar19) {
              do {
                uVar19 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0053faea;
                  auVar85 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar201._0_16_,6);
                  if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar85[0xf] < '\0') {
                    uVar32 = (ulong)(uVar19 & 0xf);
                    if (uVar32 == 8) {
                      auVar85 = vpcmpeqd_avx(auVar60._0_16_,auVar60._0_16_);
                      aVar44 = terminated.field_0;
                    }
                    else {
                      auVar65._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      auVar65._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      auVar65._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      uVar21 = 0;
                      do {
                        lVar24 = uVar21 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                        uVar23 = vmovmskps_avx(auVar65);
                        uVar10 = 0;
                        uVar22 = CONCAT44((int)(uVar21 >> 0x20),uVar23);
                        for (uVar31 = uVar22; (uVar31 & 1) == 0;
                            uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                          uVar10 = uVar10 + 1;
                        }
                        uVar31 = 0;
                        auVar85 = auVar65;
                        while (*(int *)(lVar24 + 0x40 + uVar31 * 4) != -1) {
                          pRVar5 = (context->scene->geometries).items;
                          pGVar6 = pRVar5[*(uint *)(lVar24 + 0x30 + uVar31 * 4)].ptr;
                          fVar35 = (pGVar6->time_range).lower;
                          auVar36._4_4_ = fVar35;
                          auVar36._0_4_ = fVar35;
                          auVar36._8_4_ = fVar35;
                          auVar36._12_4_ = fVar35;
                          fVar45 = pGVar6->fnumTimeSegments;
                          auVar49 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar36);
                          fVar35 = (pGVar6->time_range).upper - fVar35;
                          auVar37._4_4_ = fVar35;
                          auVar37._0_4_ = fVar35;
                          auVar37._8_4_ = fVar35;
                          auVar37._12_4_ = fVar35;
                          auVar49 = vdivps_avx(auVar49,auVar37);
                          auVar38._0_4_ = fVar45 * auVar49._0_4_;
                          auVar38._4_4_ = fVar45 * auVar49._4_4_;
                          auVar38._8_4_ = fVar45 * auVar49._8_4_;
                          auVar38._12_4_ = fVar45 * auVar49._12_4_;
                          auVar49 = vroundps_avx(auVar38,1);
                          fVar45 = fVar45 + -1.0;
                          auVar73._4_4_ = fVar45;
                          auVar73._0_4_ = fVar45;
                          auVar73._8_4_ = fVar45;
                          auVar73._12_4_ = fVar45;
                          auVar49 = vminps_avx(auVar49,auVar73);
                          auVar49 = vmaxps_avx(auVar49,_DAT_01feba10);
                          auVar56 = vsubps_avx(auVar38,auVar49);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar49);
                          iVar20 = itime.field_0.i[uVar10];
                          auVar74._4_4_ = iVar20;
                          auVar74._0_4_ = iVar20;
                          auVar74._8_4_ = iVar20;
                          auVar74._12_4_ = iVar20;
                          auVar49 = vpcmpeqd_avx(auVar74,(undefined1  [16])itime.field_0);
                          auVar49 = auVar65 & ~auVar49;
                          fVar35 = auVar56._0_4_;
                          fVar45 = auVar56._4_4_;
                          fVar47 = auVar56._12_4_;
                          fVar46 = auVar56._8_4_;
                          if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar49 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar49[0xf]) {
                            lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives +
                                             (long)iVar20 * 0x38);
                            lVar28 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 +
                                              (long)iVar20 * 0x38);
                            uVar27 = (ulong)*(uint *)(lVar24 + uVar31 * 4);
                            uVar26 = (ulong)*(uint *)(lVar24 + 0x10 + uVar31 * 4);
                            uVar23 = *(undefined4 *)(lVar7 + uVar27 * 4);
                            auVar120._4_4_ = uVar23;
                            auVar120._0_4_ = uVar23;
                            auVar120._8_4_ = uVar23;
                            auVar120._12_4_ = uVar23;
                            uVar23 = *(undefined4 *)(lVar7 + 4 + uVar27 * 4);
                            auVar134._4_4_ = uVar23;
                            auVar134._0_4_ = uVar23;
                            auVar134._8_4_ = uVar23;
                            auVar134._12_4_ = uVar23;
                            uVar23 = *(undefined4 *)(lVar7 + 8 + uVar27 * 4);
                            auVar146._4_4_ = uVar23;
                            auVar146._0_4_ = uVar23;
                            auVar146._8_4_ = uVar23;
                            auVar146._12_4_ = uVar23;
                            fVar48 = *(float *)(lVar28 + uVar27 * 4);
                            fVar61 = *(float *)(lVar28 + 4 + uVar27 * 4);
                            fVar62 = *(float *)(lVar28 + 8 + uVar27 * 4);
                            auVar50._8_4_ = 0x3f800000;
                            auVar50._0_8_ = &DAT_3f8000003f800000;
                            auVar50._12_4_ = 0x3f800000;
                            auVar49 = vsubps_avx(auVar50,auVar56);
                            auVar181._0_4_ = fVar35 * fVar48;
                            auVar181._4_4_ = fVar45 * fVar48;
                            auVar181._8_4_ = fVar46 * fVar48;
                            auVar181._12_4_ = fVar47 * fVar48;
                            auVar202._0_4_ = fVar35 * fVar61;
                            auVar202._4_4_ = fVar45 * fVar61;
                            auVar202._8_4_ = fVar46 * fVar61;
                            auVar202._12_4_ = fVar47 * fVar61;
                            auVar105._0_4_ = fVar35 * fVar62;
                            auVar105._4_4_ = fVar45 * fVar62;
                            auVar105._8_4_ = fVar46 * fVar62;
                            auVar105._12_4_ = fVar47 * fVar62;
                            auVar127 = vfmadd231ps_fma(auVar181,auVar49,auVar120);
                            auVar205 = vfmadd231ps_fma(auVar202,auVar49,auVar134);
                            auVar109 = vfmadd231ps_fma(auVar105,auVar49,auVar146);
                            uVar23 = *(undefined4 *)(lVar7 + uVar26 * 4);
                            auVar155._4_4_ = uVar23;
                            auVar155._0_4_ = uVar23;
                            auVar155._8_4_ = uVar23;
                            auVar155._12_4_ = uVar23;
                            uVar23 = *(undefined4 *)(lVar7 + 4 + uVar26 * 4);
                            auVar166._4_4_ = uVar23;
                            auVar166._0_4_ = uVar23;
                            auVar166._8_4_ = uVar23;
                            auVar166._12_4_ = uVar23;
                            uVar23 = *(undefined4 *)(lVar7 + 8 + uVar26 * 4);
                            auVar172._4_4_ = uVar23;
                            auVar172._0_4_ = uVar23;
                            auVar172._8_4_ = uVar23;
                            auVar172._12_4_ = uVar23;
                            fVar48 = *(float *)(lVar28 + uVar26 * 4);
                            fVar61 = *(float *)(lVar28 + 4 + uVar26 * 4);
                            fVar62 = *(float *)(lVar28 + 8 + uVar26 * 4);
                            auVar75._0_4_ = fVar35 * fVar48;
                            auVar75._4_4_ = fVar45 * fVar48;
                            auVar75._8_4_ = fVar46 * fVar48;
                            auVar75._12_4_ = fVar47 * fVar48;
                            auVar135._0_4_ = fVar35 * fVar61;
                            auVar135._4_4_ = fVar45 * fVar61;
                            auVar135._8_4_ = fVar46 * fVar61;
                            auVar135._12_4_ = fVar47 * fVar61;
                            auVar92._0_4_ = fVar35 * fVar62;
                            auVar92._4_4_ = fVar45 * fVar62;
                            auVar92._8_4_ = fVar46 * fVar62;
                            auVar92._12_4_ = fVar47 * fVar62;
                            auVar83 = vfmadd231ps_fma(auVar75,auVar49,auVar155);
                            auVar139 = vfmadd231ps_fma(auVar135,auVar49,auVar166);
                            auVar95 = vfmadd231ps_fma(auVar92,auVar49,auVar172);
                            uVar26 = (ulong)*(uint *)(lVar24 + 0x20 + uVar31 * 4);
                            uVar23 = *(undefined4 *)(lVar7 + uVar26 * 4);
                            auVar167._4_4_ = uVar23;
                            auVar167._0_4_ = uVar23;
                            auVar167._8_4_ = uVar23;
                            auVar167._12_4_ = uVar23;
                            uVar23 = *(undefined4 *)(lVar7 + 4 + uVar26 * 4);
                            auVar190._4_4_ = uVar23;
                            auVar190._0_4_ = uVar23;
                            auVar190._8_4_ = uVar23;
                            auVar190._12_4_ = uVar23;
                            uVar23 = *(undefined4 *)(lVar7 + 8 + uVar26 * 4);
                            auVar195._4_4_ = uVar23;
                            auVar195._0_4_ = uVar23;
                            auVar195._8_4_ = uVar23;
                            auVar195._12_4_ = uVar23;
                            fVar48 = *(float *)(lVar28 + uVar26 * 4);
                            fVar61 = *(float *)(lVar28 + 4 + uVar26 * 4);
                            fVar62 = *(float *)(lVar28 + 8 + uVar26 * 4);
                            auVar156._0_4_ = fVar48 * fVar35;
                            auVar156._4_4_ = fVar48 * fVar45;
                            auVar156._8_4_ = fVar48 * fVar46;
                            auVar156._12_4_ = fVar48 * fVar47;
                            auVar173._0_4_ = fVar61 * fVar35;
                            auVar173._4_4_ = fVar61 * fVar45;
                            auVar173._8_4_ = fVar61 * fVar46;
                            auVar173._12_4_ = fVar61 * fVar47;
                            auVar182._0_4_ = fVar62 * fVar35;
                            auVar182._4_4_ = fVar62 * fVar45;
                            auVar182._8_4_ = fVar62 * fVar46;
                            auVar182._12_4_ = fVar62 * fVar47;
                            auVar159 = vfmadd231ps_fma(auVar156,auVar49,auVar167);
                            auVar175 = vfmadd231ps_fma(auVar173,auVar49,auVar190);
                            auVar184 = vfmadd231ps_fma(auVar182,auVar49,auVar195);
                          }
                          else {
                            if (uVar22 != 0) {
                              lVar7 = *(long *)&pGVar6[2].numPrimitives;
                              uVar25 = (ulong)*(uint *)(lVar24 + uVar31 * 4);
                              uVar27 = uVar22;
                              uVar26 = uVar10;
                              do {
                                lVar28 = (long)itime.field_0.i[uVar26] * 0x38;
                                auVar49 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + lVar28) + uVar25 * 4);
                                puVar2 = (undefined4 *)
                                         (*(long *)(lVar7 + 0x38 + lVar28) + uVar25 * 4);
                                uVar12 = *puVar2;
                                uVar13 = puVar2[1];
                                uVar14 = puVar2[2];
                                *(int *)((long)&p0.field_0 + uVar26 * 4) = auVar49._0_4_;
                                uVar23 = vextractps_avx(auVar49,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar26 * 4 + 0x10) = uVar23;
                                uVar23 = vextractps_avx(auVar49,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar26 * 4 + 0x20) = uVar23;
                                *(undefined4 *)((long)&p1.field_0 + uVar26 * 4) = uVar12;
                                *(undefined4 *)((long)&p1.field_0 + uVar26 * 4 + 0x10) = uVar13;
                                *(undefined4 *)((long)&p1.field_0 + uVar26 * 4 + 0x20) = uVar14;
                                uVar27 = uVar27 ^ 1L << (uVar26 & 0x3f);
                                uVar26 = 0;
                                for (uVar11 = uVar27; (uVar11 & 1) == 0;
                                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                                  uVar26 = uVar26 + 1;
                                }
                              } while (uVar27 != 0);
                            }
                            auVar58._8_4_ = 0x3f800000;
                            auVar58._0_8_ = &DAT_3f8000003f800000;
                            auVar58._12_4_ = 0x3f800000;
                            auVar49 = vsubps_avx(auVar58,auVar56);
                            fVar48 = auVar49._0_4_;
                            fVar64 = fVar48 * (float)p0.field_0._0_4_;
                            fVar61 = auVar49._4_4_;
                            fVar86 = fVar61 * (float)p0.field_0._4_4_;
                            fVar62 = auVar49._8_4_;
                            fVar87 = fVar62 * (float)p0.field_0._8_4_;
                            fVar63 = auVar49._12_4_;
                            fVar88 = fVar63 * (float)p0.field_0._12_4_;
                            fVar89 = fVar48 * (float)p0.field_0._16_4_;
                            fVar96 = fVar61 * (float)p0.field_0._20_4_;
                            fVar97 = fVar62 * (float)p0.field_0._24_4_;
                            fVar98 = fVar63 * (float)p0.field_0._28_4_;
                            fVar99 = fVar48 * (float)p0.field_0._32_4_;
                            fVar110 = fVar61 * (float)p0.field_0._36_4_;
                            fVar111 = fVar62 * (float)p0.field_0._40_4_;
                            fVar112 = fVar63 * (float)p0.field_0._44_4_;
                            fVar113 = fVar35 * (float)p1.field_0._0_4_;
                            fVar128 = fVar45 * (float)p1.field_0._4_4_;
                            fVar129 = fVar46 * (float)p1.field_0._8_4_;
                            fVar130 = fVar47 * (float)p1.field_0._12_4_;
                            fVar131 = fVar35 * (float)p1.field_0._16_4_;
                            fVar140 = fVar45 * (float)p1.field_0._20_4_;
                            fVar141 = fVar46 * (float)p1.field_0._24_4_;
                            fVar142 = fVar47 * (float)p1.field_0._28_4_;
                            fVar143 = fVar35 * (float)p1.field_0._32_4_;
                            fVar149 = fVar45 * (float)p1.field_0._36_4_;
                            fVar150 = fVar46 * (float)p1.field_0._40_4_;
                            fVar151 = fVar47 * (float)p1.field_0._44_4_;
                            if (uVar22 != 0) {
                              lVar7 = *(long *)&pGVar6[2].numPrimitives;
                              uVar25 = (ulong)*(uint *)(lVar24 + 0x10 + uVar31 * 4);
                              uVar27 = uVar22;
                              uVar26 = uVar10;
                              do {
                                lVar28 = (long)itime.field_0.i[uVar26] * 0x38;
                                auVar49 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + lVar28) + uVar25 * 4);
                                auVar56 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + 0x38 + lVar28) + uVar25 * 4);
                                *(int *)((long)&p0.field_0 + uVar26 * 4) = auVar49._0_4_;
                                uVar23 = vextractps_avx(auVar49,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar26 * 4 + 0x10) = uVar23;
                                uVar23 = vextractps_avx(auVar49,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar26 * 4 + 0x20) = uVar23;
                                *(int *)((long)&p1.field_0 + uVar26 * 4) = auVar56._0_4_;
                                uVar23 = vextractps_avx(auVar56,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar26 * 4 + 0x10) = uVar23;
                                uVar23 = vextractps_avx(auVar56,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar26 * 4 + 0x20) = uVar23;
                                uVar27 = uVar27 ^ 1L << (uVar26 & 0x3f);
                                uVar26 = 0;
                                for (uVar11 = uVar27; (uVar11 & 1) == 0;
                                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                                  uVar26 = uVar26 + 1;
                                }
                              } while (uVar27 != 0);
                            }
                            fVar171 = fVar48 * (float)p0.field_0._0_4_;
                            fVar176 = fVar61 * (float)p0.field_0._4_4_;
                            fVar177 = fVar62 * (float)p0.field_0._8_4_;
                            fVar178 = fVar63 * (float)p0.field_0._12_4_;
                            fVar179 = fVar48 * (float)p0.field_0._16_4_;
                            fVar185 = fVar61 * (float)p0.field_0._20_4_;
                            fVar186 = fVar62 * (float)p0.field_0._24_4_;
                            fVar187 = fVar63 * (float)p0.field_0._28_4_;
                            fVar152 = fVar48 * (float)p0.field_0._32_4_;
                            fVar160 = fVar61 * (float)p0.field_0._36_4_;
                            fVar161 = fVar62 * (float)p0.field_0._40_4_;
                            fVar162 = fVar63 * (float)p0.field_0._44_4_;
                            fVar188 = fVar35 * (float)p1.field_0._0_4_;
                            fVar191 = fVar45 * (float)p1.field_0._4_4_;
                            fVar192 = fVar46 * (float)p1.field_0._8_4_;
                            fVar193 = fVar47 * (float)p1.field_0._12_4_;
                            fVar194 = fVar35 * (float)p1.field_0._16_4_;
                            fVar197 = fVar45 * (float)p1.field_0._20_4_;
                            fVar198 = fVar46 * (float)p1.field_0._24_4_;
                            fVar199 = fVar47 * (float)p1.field_0._28_4_;
                            fVar163 = fVar35 * (float)p1.field_0._32_4_;
                            fVar168 = fVar45 * (float)p1.field_0._36_4_;
                            fVar169 = fVar46 * (float)p1.field_0._40_4_;
                            fVar170 = fVar47 * (float)p1.field_0._44_4_;
                            if (uVar22 != 0) {
                              lVar7 = *(long *)&pGVar6[2].numPrimitives;
                              uVar25 = (ulong)*(uint *)(lVar24 + 0x20 + uVar31 * 4);
                              uVar27 = uVar22;
                              uVar26 = uVar10;
                              do {
                                lVar28 = (long)itime.field_0.i[uVar26] * 0x38;
                                auVar49 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + lVar28) + uVar25 * 4);
                                auVar56 = *(undefined1 (*) [16])
                                           (*(long *)(lVar7 + 0x38 + lVar28) + uVar25 * 4);
                                *(int *)((long)&p0.field_0 + uVar26 * 4) = auVar49._0_4_;
                                uVar23 = vextractps_avx(auVar49,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar26 * 4 + 0x10) = uVar23;
                                uVar23 = vextractps_avx(auVar49,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar26 * 4 + 0x20) = uVar23;
                                *(int *)((long)&p1.field_0 + uVar26 * 4) = auVar56._0_4_;
                                uVar23 = vextractps_avx(auVar56,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar26 * 4 + 0x10) = uVar23;
                                uVar23 = vextractps_avx(auVar56,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar26 * 4 + 0x20) = uVar23;
                                uVar27 = uVar27 ^ 1L << (uVar26 & 0x3f);
                                uVar26 = 0;
                                for (uVar11 = uVar27; (uVar11 & 1) == 0;
                                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                                  uVar26 = uVar26 + 1;
                                }
                              } while (uVar27 != 0);
                            }
                            auVar127._0_4_ = fVar64 + fVar113;
                            auVar127._4_4_ = fVar86 + fVar128;
                            auVar127._8_4_ = fVar87 + fVar129;
                            auVar127._12_4_ = fVar88 + fVar130;
                            auVar205._0_4_ = fVar89 + fVar131;
                            auVar205._4_4_ = fVar96 + fVar140;
                            auVar205._8_4_ = fVar97 + fVar141;
                            auVar205._12_4_ = fVar98 + fVar142;
                            auVar109._0_4_ = fVar99 + fVar143;
                            auVar109._4_4_ = fVar110 + fVar149;
                            auVar109._8_4_ = fVar111 + fVar150;
                            auVar109._12_4_ = fVar112 + fVar151;
                            auVar83._0_4_ = fVar171 + fVar188;
                            auVar83._4_4_ = fVar176 + fVar191;
                            auVar83._8_4_ = fVar177 + fVar192;
                            auVar83._12_4_ = fVar178 + fVar193;
                            auVar139._0_4_ = fVar179 + fVar194;
                            auVar139._4_4_ = fVar185 + fVar197;
                            auVar139._8_4_ = fVar186 + fVar198;
                            auVar139._12_4_ = fVar187 + fVar199;
                            auVar95._0_4_ = fVar152 + fVar163;
                            auVar95._4_4_ = fVar160 + fVar168;
                            auVar95._8_4_ = fVar161 + fVar169;
                            auVar95._12_4_ = fVar162 + fVar170;
                            auVar159._0_4_ =
                                 fVar48 * (float)p0.field_0._0_4_ + fVar35 * (float)p1.field_0._0_4_
                            ;
                            auVar159._4_4_ =
                                 fVar61 * (float)p0.field_0._4_4_ + fVar45 * (float)p1.field_0._4_4_
                            ;
                            auVar159._8_4_ =
                                 fVar62 * (float)p0.field_0._8_4_ + fVar46 * (float)p1.field_0._8_4_
                            ;
                            auVar159._12_4_ =
                                 fVar63 * (float)p0.field_0._12_4_ +
                                 fVar47 * (float)p1.field_0._12_4_;
                            auVar175._0_4_ =
                                 fVar48 * (float)p0.field_0._16_4_ +
                                 fVar35 * (float)p1.field_0._16_4_;
                            auVar175._4_4_ =
                                 fVar61 * (float)p0.field_0._20_4_ +
                                 fVar45 * (float)p1.field_0._20_4_;
                            auVar175._8_4_ =
                                 fVar62 * (float)p0.field_0._24_4_ +
                                 fVar46 * (float)p1.field_0._24_4_;
                            auVar175._12_4_ =
                                 fVar63 * (float)p0.field_0._28_4_ +
                                 fVar47 * (float)p1.field_0._28_4_;
                            auVar184._0_4_ =
                                 fVar48 * (float)p0.field_0._32_4_ +
                                 fVar35 * (float)p1.field_0._32_4_;
                            auVar184._4_4_ =
                                 fVar61 * (float)p0.field_0._36_4_ +
                                 fVar45 * (float)p1.field_0._36_4_;
                            auVar184._8_4_ =
                                 fVar62 * (float)p0.field_0._40_4_ +
                                 fVar46 * (float)p1.field_0._40_4_;
                            auVar184._12_4_ =
                                 fVar63 * (float)p0.field_0._44_4_ +
                                 fVar47 * (float)p1.field_0._44_4_;
                          }
                          local_16e8 = *(undefined8 *)(lVar24 + 0x30);
                          uStack_16e0 = *(undefined8 *)(lVar24 + 0x38);
                          auVar49 = *(undefined1 (*) [16])ray;
                          auVar56 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar100 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar115 = vsubps_avx(auVar127,auVar49);
                          auVar116 = vsubps_avx(auVar205,auVar56);
                          auVar114 = vsubps_avx(auVar109,auVar100);
                          auVar164 = vsubps_avx(auVar83,auVar49);
                          auVar165 = vsubps_avx(auVar139,auVar56);
                          auVar189 = vsubps_avx(auVar95,auVar100);
                          auVar36 = vsubps_avx(auVar159,auVar49);
                          auVar37 = vsubps_avx(auVar175,auVar56);
                          auVar100 = vsubps_avx(auVar184,auVar100);
                          auVar38 = vsubps_avx(auVar36,auVar115);
                          auVar73 = vsubps_avx(auVar37,auVar116);
                          auVar74 = vsubps_avx(auVar100,auVar114);
                          auVar93._0_4_ = auVar36._0_4_ + auVar115._0_4_;
                          auVar93._4_4_ = auVar36._4_4_ + auVar115._4_4_;
                          auVar93._8_4_ = auVar36._8_4_ + auVar115._8_4_;
                          auVar93._12_4_ = auVar36._12_4_ + auVar115._12_4_;
                          auVar136._0_4_ = auVar37._0_4_ + auVar116._0_4_;
                          auVar136._4_4_ = auVar37._4_4_ + auVar116._4_4_;
                          auVar136._8_4_ = auVar37._8_4_ + auVar116._8_4_;
                          auVar136._12_4_ = auVar37._12_4_ + auVar116._12_4_;
                          fVar99 = auVar114._0_4_;
                          auVar157._0_4_ = fVar99 + auVar100._0_4_;
                          fVar110 = auVar114._4_4_;
                          auVar157._4_4_ = fVar110 + auVar100._4_4_;
                          fVar111 = auVar114._8_4_;
                          auVar157._8_4_ = fVar111 + auVar100._8_4_;
                          fVar112 = auVar114._12_4_;
                          auVar157._12_4_ = fVar112 + auVar100._12_4_;
                          auVar183._0_4_ = auVar74._0_4_ * auVar136._0_4_;
                          auVar183._4_4_ = auVar74._4_4_ * auVar136._4_4_;
                          auVar183._8_4_ = auVar74._8_4_ * auVar136._8_4_;
                          auVar183._12_4_ = auVar74._12_4_ * auVar136._12_4_;
                          auVar127 = vfmsub231ps_fma(auVar183,auVar73,auVar157);
                          auVar174._0_4_ = auVar157._0_4_ * auVar38._0_4_;
                          auVar174._4_4_ = auVar157._4_4_ * auVar38._4_4_;
                          auVar174._8_4_ = auVar157._8_4_ * auVar38._8_4_;
                          auVar174._12_4_ = auVar157._12_4_ * auVar38._12_4_;
                          auVar56 = vfmsub231ps_fma(auVar174,auVar74,auVar93);
                          auVar94._0_4_ = auVar93._0_4_ * auVar73._0_4_;
                          auVar94._4_4_ = auVar93._4_4_ * auVar73._4_4_;
                          auVar94._8_4_ = auVar93._8_4_ * auVar73._8_4_;
                          auVar94._12_4_ = auVar93._12_4_ * auVar73._12_4_;
                          auVar58 = vfmsub231ps_fma(auVar94,auVar38,auVar136);
                          auVar49 = *(undefined1 (*) [16])(ray + 0x60);
                          fVar89 = auVar49._0_4_;
                          auVar196._0_4_ = fVar89 * auVar58._0_4_;
                          fVar96 = auVar49._4_4_;
                          auVar196._4_4_ = fVar96 * auVar58._4_4_;
                          fVar97 = auVar49._8_4_;
                          auVar196._8_4_ = fVar97 * auVar58._8_4_;
                          fVar98 = auVar49._12_4_;
                          auVar196._12_4_ = fVar98 * auVar58._12_4_;
                          auVar49 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar58 = vfmadd231ps_fma(auVar196,auVar49,auVar56);
                          auVar56 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar83 = vfmadd231ps_fma(auVar58,auVar56,auVar127);
                          auVar58 = vsubps_avx(auVar116,auVar165);
                          auVar127 = vsubps_avx(auVar114,auVar189);
                          auVar137._0_4_ = auVar165._0_4_ + auVar116._0_4_;
                          auVar137._4_4_ = auVar165._4_4_ + auVar116._4_4_;
                          auVar137._8_4_ = auVar165._8_4_ + auVar116._8_4_;
                          auVar137._12_4_ = auVar165._12_4_ + auVar116._12_4_;
                          auVar203._0_4_ = fVar99 + auVar189._0_4_;
                          auVar203._4_4_ = fVar110 + auVar189._4_4_;
                          auVar203._8_4_ = fVar111 + auVar189._8_4_;
                          auVar203._12_4_ = fVar112 + auVar189._12_4_;
                          fVar35 = auVar127._0_4_;
                          auVar121._0_4_ = auVar137._0_4_ * fVar35;
                          fVar47 = auVar127._4_4_;
                          auVar121._4_4_ = auVar137._4_4_ * fVar47;
                          fVar62 = auVar127._8_4_;
                          auVar121._8_4_ = auVar137._8_4_ * fVar62;
                          fVar86 = auVar127._12_4_;
                          auVar121._12_4_ = auVar137._12_4_ * fVar86;
                          auVar109 = vfmsub231ps_fma(auVar121,auVar58,auVar203);
                          auVar205 = vsubps_avx(auVar115,auVar164);
                          fVar45 = auVar205._0_4_;
                          auVar204._0_4_ = auVar203._0_4_ * fVar45;
                          fVar48 = auVar205._4_4_;
                          auVar204._4_4_ = auVar203._4_4_ * fVar48;
                          fVar63 = auVar205._8_4_;
                          auVar204._8_4_ = auVar203._8_4_ * fVar63;
                          fVar87 = auVar205._12_4_;
                          auVar204._12_4_ = auVar203._12_4_ * fVar87;
                          auVar147._0_4_ = auVar164._0_4_ + auVar115._0_4_;
                          auVar147._4_4_ = auVar164._4_4_ + auVar115._4_4_;
                          auVar147._8_4_ = auVar164._8_4_ + auVar115._8_4_;
                          auVar147._12_4_ = auVar164._12_4_ + auVar115._12_4_;
                          auVar114 = vfmsub231ps_fma(auVar204,auVar127,auVar147);
                          fVar46 = auVar58._0_4_;
                          auVar148._0_4_ = auVar147._0_4_ * fVar46;
                          fVar61 = auVar58._4_4_;
                          auVar148._4_4_ = auVar147._4_4_ * fVar61;
                          fVar64 = auVar58._8_4_;
                          auVar148._8_4_ = auVar147._8_4_ * fVar64;
                          fVar88 = auVar58._12_4_;
                          auVar148._12_4_ = auVar147._12_4_ * fVar88;
                          auVar139 = vfmsub231ps_fma(auVar148,auVar205,auVar137);
                          auVar138._0_4_ = fVar89 * auVar139._0_4_;
                          auVar138._4_4_ = fVar96 * auVar139._4_4_;
                          auVar138._8_4_ = fVar97 * auVar139._8_4_;
                          auVar138._12_4_ = fVar98 * auVar139._12_4_;
                          auVar114 = vfmadd231ps_fma(auVar138,auVar49,auVar114);
                          auVar139 = vfmadd231ps_fma(auVar114,auVar56,auVar109);
                          auVar109 = vsubps_avx(auVar164,auVar36);
                          auVar51._0_4_ = auVar164._0_4_ + auVar36._0_4_;
                          auVar51._4_4_ = auVar164._4_4_ + auVar36._4_4_;
                          auVar51._8_4_ = auVar164._8_4_ + auVar36._8_4_;
                          auVar51._12_4_ = auVar164._12_4_ + auVar36._12_4_;
                          auVar164 = vsubps_avx(auVar165,auVar37);
                          auVar39._0_4_ = auVar165._0_4_ + auVar37._0_4_;
                          auVar39._4_4_ = auVar165._4_4_ + auVar37._4_4_;
                          auVar39._8_4_ = auVar165._8_4_ + auVar37._8_4_;
                          auVar39._12_4_ = auVar165._12_4_ + auVar37._12_4_;
                          auVar165 = vsubps_avx(auVar189,auVar100);
                          auVar76._0_4_ = auVar189._0_4_ + auVar100._0_4_;
                          auVar76._4_4_ = auVar189._4_4_ + auVar100._4_4_;
                          auVar76._8_4_ = auVar189._8_4_ + auVar100._8_4_;
                          auVar76._12_4_ = auVar189._12_4_ + auVar100._12_4_;
                          auVar106._0_4_ = auVar165._0_4_ * auVar39._0_4_;
                          auVar106._4_4_ = auVar165._4_4_ * auVar39._4_4_;
                          auVar106._8_4_ = auVar165._8_4_ * auVar39._8_4_;
                          auVar106._12_4_ = auVar165._12_4_ * auVar39._12_4_;
                          auVar114 = vfmsub231ps_fma(auVar106,auVar164,auVar76);
                          auVar77._0_4_ = auVar109._0_4_ * auVar76._0_4_;
                          auVar77._4_4_ = auVar109._4_4_ * auVar76._4_4_;
                          auVar77._8_4_ = auVar109._8_4_ * auVar76._8_4_;
                          auVar77._12_4_ = auVar109._12_4_ * auVar76._12_4_;
                          auVar100 = vfmsub231ps_fma(auVar77,auVar165,auVar51);
                          auVar52._0_4_ = auVar164._0_4_ * auVar51._0_4_;
                          auVar52._4_4_ = auVar164._4_4_ * auVar51._4_4_;
                          auVar52._8_4_ = auVar164._8_4_ * auVar51._8_4_;
                          auVar52._12_4_ = auVar164._12_4_ * auVar51._12_4_;
                          auVar189 = vfmsub231ps_fma(auVar52,auVar109,auVar39);
                          auVar40._0_4_ = fVar89 * auVar189._0_4_;
                          auVar40._4_4_ = fVar96 * auVar189._4_4_;
                          auVar40._8_4_ = fVar97 * auVar189._8_4_;
                          auVar40._12_4_ = fVar98 * auVar189._12_4_;
                          auVar100 = vfmadd231ps_fma(auVar40,auVar49,auVar100);
                          auVar189 = vfmadd231ps_fma(auVar100,auVar56,auVar114);
                          auVar122._0_4_ = auVar189._0_4_ + auVar83._0_4_ + auVar139._0_4_;
                          auVar122._4_4_ = auVar189._4_4_ + auVar83._4_4_ + auVar139._4_4_;
                          auVar122._8_4_ = auVar189._8_4_ + auVar83._8_4_ + auVar139._8_4_;
                          auVar122._12_4_ = auVar189._12_4_ + auVar83._12_4_ + auVar139._12_4_;
                          auVar100 = vandps_avx(auVar180,auVar122);
                          auVar53._0_4_ = auVar100._0_4_ * 1.1920929e-07;
                          auVar53._4_4_ = auVar100._4_4_ * 1.1920929e-07;
                          auVar53._8_4_ = auVar100._8_4_ * 1.1920929e-07;
                          auVar53._12_4_ = auVar100._12_4_ * 1.1920929e-07;
                          auVar100 = vminps_avx(auVar83,auVar139);
                          auVar100 = vminps_avx(auVar100,auVar189);
                          uVar26 = CONCAT44(auVar53._4_4_,auVar53._0_4_);
                          auVar107._0_8_ = uVar26 ^ 0x8000000080000000;
                          auVar107._8_4_ = -auVar53._8_4_;
                          auVar107._12_4_ = -auVar53._12_4_;
                          auVar100 = vcmpps_avx(auVar100,auVar107,5);
                          auVar114 = vmaxps_avx(auVar83,auVar139);
                          auVar114 = vmaxps_avx(auVar114,auVar189);
                          auVar114 = vcmpps_avx(auVar114,auVar53,2);
                          auVar100 = vorps_avx(auVar100,auVar114);
                          auVar114 = auVar85 & auVar100;
                          auVar100 = vandps_avx(auVar100,auVar85);
                          if ((((auVar114 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar114 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar114 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar114[0xf] < '\0') {
                            auVar41._0_4_ = fVar46 * auVar74._0_4_;
                            auVar41._4_4_ = fVar61 * auVar74._4_4_;
                            auVar41._8_4_ = fVar64 * auVar74._8_4_;
                            auVar41._12_4_ = fVar88 * auVar74._12_4_;
                            auVar189 = vfmsub213ps_fma(auVar73,auVar127,auVar41);
                            auVar78._0_4_ = auVar164._0_4_ * fVar35;
                            auVar78._4_4_ = auVar164._4_4_ * fVar47;
                            auVar78._8_4_ = auVar164._8_4_ * fVar62;
                            auVar78._12_4_ = auVar164._12_4_ * fVar86;
                            auVar108._0_4_ = auVar165._0_4_ * fVar45;
                            auVar108._4_4_ = auVar165._4_4_ * fVar48;
                            auVar108._8_4_ = auVar165._8_4_ * fVar63;
                            auVar108._12_4_ = auVar165._12_4_ * fVar87;
                            auVar36 = vfmsub213ps_fma(auVar165,auVar58,auVar78);
                            auVar114 = vandps_avx(auVar180,auVar41);
                            auVar165 = vandps_avx(auVar180,auVar78);
                            auVar114 = vcmpps_avx(auVar114,auVar165,1);
                            auVar189 = vblendvps_avx(auVar36,auVar189,auVar114);
                            auVar123._0_4_ = auVar109._0_4_ * fVar46;
                            auVar123._4_4_ = auVar109._4_4_ * fVar61;
                            auVar123._8_4_ = auVar109._8_4_ * fVar64;
                            auVar123._12_4_ = auVar109._12_4_ * fVar88;
                            auVar36 = vfmsub213ps_fma(auVar109,auVar127,auVar108);
                            auVar79._0_4_ = fVar35 * auVar38._0_4_;
                            auVar79._4_4_ = fVar47 * auVar38._4_4_;
                            auVar79._8_4_ = fVar62 * auVar38._8_4_;
                            auVar79._12_4_ = fVar86 * auVar38._12_4_;
                            auVar37 = vfmsub213ps_fma(auVar74,auVar205,auVar79);
                            auVar114 = vandps_avx(auVar180,auVar79);
                            auVar165 = vandps_avx(auVar180,auVar108);
                            auVar114 = vcmpps_avx(auVar114,auVar165,1);
                            auVar165 = vblendvps_avx(auVar36,auVar37,auVar114);
                            auVar18._4_4_ = fVar48 * auVar73._4_4_;
                            auVar18._0_4_ = fVar45 * auVar73._0_4_;
                            auVar18._8_4_ = fVar63 * auVar73._8_4_;
                            auVar18._12_4_ = fVar87 * auVar73._12_4_;
                            auVar36 = vfmsub213ps_fma(auVar38,auVar58,auVar18);
                            auVar37 = vfmsub213ps_fma(auVar164,auVar205,auVar123);
                            auVar114 = vandps_avx(auVar180,auVar18);
                            auVar164 = vandps_avx(auVar180,auVar123);
                            auVar114 = vcmpps_avx(auVar114,auVar164,1);
                            aVar3 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                    vblendvps_avx(auVar37,auVar36,auVar114);
                            auVar54._0_4_ = aVar3.v[0] * fVar89;
                            auVar54._4_4_ = aVar3.v[1] * fVar96;
                            auVar54._8_4_ = aVar3.v[2] * fVar97;
                            auVar54._12_4_ = aVar3.v[3] * fVar98;
                            auVar49 = vfmadd213ps_fma(auVar49,auVar165,auVar54);
                            auVar49 = vfmadd213ps_fma(auVar56,auVar189,auVar49);
                            auVar55._0_4_ = auVar49._0_4_ + auVar49._0_4_;
                            auVar55._4_4_ = auVar49._4_4_ + auVar49._4_4_;
                            auVar55._8_4_ = auVar49._8_4_ + auVar49._8_4_;
                            auVar55._12_4_ = auVar49._12_4_ + auVar49._12_4_;
                            auVar124._0_4_ = aVar3.v[0] * fVar99;
                            auVar124._4_4_ = aVar3.v[1] * fVar110;
                            auVar124._8_4_ = aVar3.v[2] * fVar111;
                            auVar124._12_4_ = aVar3.v[3] * fVar112;
                            auVar49 = vfmadd213ps_fma(auVar116,auVar165,auVar124);
                            auVar56 = vfmadd213ps_fma(auVar115,auVar189,auVar49);
                            auVar49 = vrcpps_avx(auVar55);
                            auVar200._8_4_ = 0x3f800000;
                            auVar200._0_8_ = &DAT_3f8000003f800000;
                            auVar200._12_4_ = 0x3f800000;
                            auVar114 = vfnmadd213ps_fma(auVar49,auVar55,auVar200);
                            auVar49 = vfmadd132ps_fma(auVar114,auVar49,auVar49);
                            auVar125._0_4_ = auVar49._0_4_ * (auVar56._0_4_ + auVar56._0_4_);
                            auVar125._4_4_ = auVar49._4_4_ * (auVar56._4_4_ + auVar56._4_4_);
                            auVar125._8_4_ = auVar49._8_4_ * (auVar56._8_4_ + auVar56._8_4_);
                            auVar125._12_4_ = auVar49._12_4_ * (auVar56._12_4_ + auVar56._12_4_);
                            auVar49 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar125,2);
                            auVar56 = vcmpps_avx(auVar125,*(undefined1 (*) [16])(ray + 0x80),2);
                            auVar49 = vandps_avx(auVar56,auVar49);
                            uVar26 = CONCAT44(auVar55._4_4_,auVar55._0_4_);
                            auVar158._0_8_ = uVar26 ^ 0x8000000080000000;
                            auVar158._8_4_ = -auVar55._8_4_;
                            auVar158._12_4_ = -auVar55._12_4_;
                            auVar56 = vcmpps_avx(auVar158,auVar55,4);
                            auVar49 = vandps_avx(auVar56,auVar49);
                            auVar49 = vpslld_avx(auVar49,0x1f);
                            auVar56 = vpsrad_avx(auVar49,0x1f);
                            auVar49 = auVar100 & auVar56;
                            auVar100 = vandps_avx(auVar56,auVar100);
                            if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar49 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar49[0xf] < '\0') {
                              local_1838 = aVar3;
                              local_1828 = auVar165;
                              local_1818 = auVar189;
                              local_1808 = auVar125;
                              local_17f8 = auVar122;
                              _local_17e8 = auVar139;
                              _local_17d8 = auVar83;
                            }
                          }
                          auVar206 = ZEXT1664(CONCAT412(0x7f800000,
                                                        CONCAT48(0x7f800000,0x7f8000007f800000)));
                          pGVar6 = pRVar5[*(uint *)((long)&local_16e8 + uVar31 * 4)].ptr;
                          uVar19 = pGVar6->mask;
                          auVar42._4_4_ = uVar19;
                          auVar42._0_4_ = uVar19;
                          auVar42._8_4_ = uVar19;
                          auVar42._12_4_ = uVar19;
                          auVar49 = vpand_avx(auVar42,*(undefined1 (*) [16])(ray + 0x90));
                          auVar49 = vpcmpeqd_avx(auVar49,_DAT_01feba10);
                          auVar56 = auVar100 & ~auVar49;
                          if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar56 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar56[0xf] < '\0') {
                            aVar43 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     vandnps_avx(auVar49,auVar100);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar49 = vandps_avx(auVar180,local_17f8);
                              auVar56 = vrcpps_avx(local_17f8);
                              auVar126._8_4_ = 0x3f800000;
                              auVar126._0_8_ = &DAT_3f8000003f800000;
                              auVar126._12_4_ = 0x3f800000;
                              auVar100 = vfnmadd213ps_fma(auVar56,local_17f8,auVar126);
                              auVar56 = vfmadd132ps_fma(auVar100,auVar56,auVar56);
                              auVar80._8_4_ = 0x219392ef;
                              auVar80._0_8_ = 0x219392ef219392ef;
                              auVar80._12_4_ = 0x219392ef;
                              auVar49 = vcmpps_avx(auVar49,auVar80,5);
                              auVar49 = vandps_avx(auVar49,auVar56);
                              auVar81._0_4_ = auVar49._0_4_ * (float)local_17d8._0_4_;
                              auVar81._4_4_ = auVar49._4_4_ * (float)local_17d8._4_4_;
                              auVar81._8_4_ = auVar49._8_4_ * fStack_17d0;
                              auVar81._12_4_ = auVar49._12_4_ * fStack_17cc;
                              vminps_avx(auVar81,auVar126);
                              auVar57._0_4_ = auVar49._0_4_ * (float)local_17e8._0_4_;
                              auVar57._4_4_ = auVar49._4_4_ * (float)local_17e8._4_4_;
                              auVar57._8_4_ = auVar49._8_4_ * fStack_17e0;
                              auVar57._12_4_ = auVar49._12_4_ * fStack_17dc;
                              auVar49 = vminps_avx(auVar57,auVar126);
                              p0.field_0._0_8_ = local_1818._0_8_;
                              p0.field_0._8_8_ = local_1818._8_8_;
                              p0.field_0._16_8_ = local_1828._0_8_;
                              p0.field_0._24_8_ = local_1828._8_8_;
                              p0.field_0.field_0.z.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)local_1838;
                              vpcmpeqd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar49));
                              auVar49 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar56 = vblendvps_avx(auVar49,local_1808,(undefined1  [16])aVar43);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar56;
                              itime.field_0 = aVar43;
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar6->userPtr;
                              p1.field_0._16_8_ = context->user;
                              p1.field_0._24_8_ = ray;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._40_4_ = 4;
                              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                auVar206 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                              if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0)
                              {
                                auVar56 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                auVar56 = auVar56 ^ _DAT_01febe20;
                              }
                              else {
                                p_Var8 = context->args->filter;
                                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var8)((RTCFilterFunctionNArguments *)&p1);
                                  auVar206 = ZEXT1664(CONCAT412(0x7f800000,
                                                                CONCAT48(0x7f800000,
                                                                         0x7f8000007f800000)));
                                }
                                auVar100 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                        (undefined1  [16])itime.field_0);
                                auVar56 = auVar100 ^ _DAT_01febe20;
                                auVar82._8_4_ = 0xff800000;
                                auVar82._0_8_ = 0xff800000ff800000;
                                auVar82._12_4_ = 0xff800000;
                                auVar100 = vblendvps_avx(auVar82,*(undefined1 (*) [16])
                                                                  (p1.field_0._24_8_ + 0x80),
                                                         auVar100);
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar100;
                              }
                              auVar56 = vpslld_avx(auVar56,0x1f);
                              aVar43 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vpsrad_avx(auVar56,0x1f);
                              auVar49 = vblendvps_avx(auVar49,*(undefined1 (*) [16])pRVar1,auVar56);
                              *(undefined1 (*) [16])pRVar1 = auVar49;
                            }
                            auVar85 = vpandn_avx((undefined1  [16])aVar43,auVar85);
                          }
                          if (((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                && (auVar85 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && -1 < auVar85[0xf]) ||
                             (bVar34 = 2 < uVar31, uVar31 = uVar31 + 1, bVar34)) break;
                        }
                        auVar49 = vandps_avx(auVar85,auVar65);
                        auVar65 = auVar65 & auVar85;
                      } while (((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar65 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar65[0xf] < '\0') &&
                              (uVar21 = uVar21 + 1, auVar65 = auVar49, uVar21 < uVar32 - 8));
                      auVar85 = vpcmpeqd_avx(auVar85,auVar85);
                      aVar44._0_4_ = auVar49._0_4_ ^ auVar85._0_4_;
                      aVar44._4_4_ = auVar49._4_4_ ^ auVar85._4_4_;
                      aVar44._8_4_ = auVar49._8_4_ ^ auVar85._8_4_;
                      aVar44._12_4_ = auVar49._12_4_ ^ auVar85._12_4_;
                    }
                    auVar60 = ZEXT1664(auVar85);
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vorps_avx((undefined1  [16])aVar44,(undefined1  [16])terminated.field_0);
                    auVar85 = auVar85 & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar85[0xf]) goto LAB_0053faea;
                    auVar60 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                    auVar84._8_4_ = 0xff800000;
                    auVar84._0_8_ = 0xff800000ff800000;
                    auVar84._12_4_ = 0xff800000;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar84,
                                       (undefined1  [16])terminated.field_0);
                    iVar20 = 0;
                    break;
                  }
                  goto LAB_0053fafb;
                }
                uVar21 = root.ptr & 0xfffffffffffffff0;
                auVar85 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar201._0_16_,6);
                auVar201 = ZEXT1664(auVar206._0_16_);
                uVar32 = 0;
                root.ptr = 8;
                do {
                  sVar4 = *(size_t *)(uVar21 + uVar32 * 8);
                  if (sVar4 != 8) {
                    uVar23 = *(undefined4 *)(uVar21 + 0x80 + uVar32 * 4);
                    auVar66._4_4_ = uVar23;
                    auVar66._0_4_ = uVar23;
                    auVar66._8_4_ = uVar23;
                    auVar66._12_4_ = uVar23;
                    uVar23 = *(undefined4 *)(uVar21 + 0x20 + uVar32 * 4);
                    auVar90._4_4_ = uVar23;
                    auVar90._0_4_ = uVar23;
                    auVar90._8_4_ = uVar23;
                    auVar90._12_4_ = uVar23;
                    auVar49 = *(undefined1 (*) [16])(ray + 0x70);
                    auVar56 = vfmadd231ps_fma(auVar90,auVar49,auVar66);
                    uVar23 = *(undefined4 *)(uVar21 + 0xa0 + uVar32 * 4);
                    auVar67._4_4_ = uVar23;
                    auVar67._0_4_ = uVar23;
                    auVar67._8_4_ = uVar23;
                    auVar67._12_4_ = uVar23;
                    uVar23 = *(undefined4 *)(uVar21 + 0x40 + uVar32 * 4);
                    auVar101._4_4_ = uVar23;
                    auVar101._0_4_ = uVar23;
                    auVar101._8_4_ = uVar23;
                    auVar101._12_4_ = uVar23;
                    auVar65 = vfmadd231ps_fma(auVar101,auVar49,auVar67);
                    uVar23 = *(undefined4 *)(uVar21 + 0xc0 + uVar32 * 4);
                    auVar68._4_4_ = uVar23;
                    auVar68._0_4_ = uVar23;
                    auVar68._8_4_ = uVar23;
                    auVar68._12_4_ = uVar23;
                    uVar23 = *(undefined4 *)(uVar21 + 0x60 + uVar32 * 4);
                    auVar117._4_4_ = uVar23;
                    auVar117._0_4_ = uVar23;
                    auVar117._8_4_ = uVar23;
                    auVar117._12_4_ = uVar23;
                    auVar100 = vfmadd231ps_fma(auVar117,auVar49,auVar68);
                    uVar23 = *(undefined4 *)(uVar21 + 0x90 + uVar32 * 4);
                    auVar69._4_4_ = uVar23;
                    auVar69._0_4_ = uVar23;
                    auVar69._8_4_ = uVar23;
                    auVar69._12_4_ = uVar23;
                    uVar23 = *(undefined4 *)(uVar21 + 0x30 + uVar32 * 4);
                    auVar132._4_4_ = uVar23;
                    auVar132._0_4_ = uVar23;
                    auVar132._8_4_ = uVar23;
                    auVar132._12_4_ = uVar23;
                    auVar114 = vfmadd231ps_fma(auVar132,auVar49,auVar69);
                    uVar23 = *(undefined4 *)(uVar21 + 0xb0 + uVar32 * 4);
                    auVar70._4_4_ = uVar23;
                    auVar70._0_4_ = uVar23;
                    auVar70._8_4_ = uVar23;
                    auVar70._12_4_ = uVar23;
                    uVar23 = *(undefined4 *)(uVar21 + 0x50 + uVar32 * 4);
                    auVar144._4_4_ = uVar23;
                    auVar144._0_4_ = uVar23;
                    auVar144._8_4_ = uVar23;
                    auVar144._12_4_ = uVar23;
                    auVar115 = vfmadd231ps_fma(auVar144,auVar49,auVar70);
                    uVar23 = *(undefined4 *)(uVar21 + 0xd0 + uVar32 * 4);
                    auVar71._4_4_ = uVar23;
                    auVar71._0_4_ = uVar23;
                    auVar71._8_4_ = uVar23;
                    auVar71._12_4_ = uVar23;
                    uVar23 = *(undefined4 *)(uVar21 + 0x70 + uVar32 * 4);
                    auVar153._4_4_ = uVar23;
                    auVar153._0_4_ = uVar23;
                    auVar153._8_4_ = uVar23;
                    auVar153._12_4_ = uVar23;
                    auVar116 = vfmadd231ps_fma(auVar153,auVar49,auVar71);
                    auVar15._8_8_ = tray.org.field_0._8_8_;
                    auVar15._0_8_ = tray.org.field_0._0_8_;
                    auVar16._8_8_ = tray.org.field_0._24_8_;
                    auVar16._0_8_ = tray.org.field_0._16_8_;
                    auVar17._8_8_ = tray.org.field_0._40_8_;
                    auVar17._0_8_ = tray.org.field_0._32_8_;
                    auVar56 = vsubps_avx(auVar56,auVar15);
                    auVar91._0_4_ = tray.rdir.field_0._0_4_ * auVar56._0_4_;
                    auVar91._4_4_ = tray.rdir.field_0._4_4_ * auVar56._4_4_;
                    auVar91._8_4_ = tray.rdir.field_0._8_4_ * auVar56._8_4_;
                    auVar91._12_4_ = tray.rdir.field_0._12_4_ * auVar56._12_4_;
                    auVar56 = vsubps_avx(auVar65,auVar16);
                    auVar102._0_4_ = tray.rdir.field_0._16_4_ * auVar56._0_4_;
                    auVar102._4_4_ = tray.rdir.field_0._20_4_ * auVar56._4_4_;
                    auVar102._8_4_ = tray.rdir.field_0._24_4_ * auVar56._8_4_;
                    auVar102._12_4_ = tray.rdir.field_0._28_4_ * auVar56._12_4_;
                    auVar56 = vsubps_avx(auVar100,auVar17);
                    auVar118._0_4_ = tray.rdir.field_0._32_4_ * auVar56._0_4_;
                    auVar118._4_4_ = tray.rdir.field_0._36_4_ * auVar56._4_4_;
                    auVar118._8_4_ = tray.rdir.field_0._40_4_ * auVar56._8_4_;
                    auVar118._12_4_ = tray.rdir.field_0._44_4_ * auVar56._12_4_;
                    auVar56 = vsubps_avx(auVar114,auVar15);
                    auVar133._0_4_ = tray.rdir.field_0._0_4_ * auVar56._0_4_;
                    auVar133._4_4_ = tray.rdir.field_0._4_4_ * auVar56._4_4_;
                    auVar133._8_4_ = tray.rdir.field_0._8_4_ * auVar56._8_4_;
                    auVar133._12_4_ = tray.rdir.field_0._12_4_ * auVar56._12_4_;
                    auVar56 = vsubps_avx(auVar115,auVar16);
                    auVar145._0_4_ = tray.rdir.field_0._16_4_ * auVar56._0_4_;
                    auVar145._4_4_ = tray.rdir.field_0._20_4_ * auVar56._4_4_;
                    auVar145._8_4_ = tray.rdir.field_0._24_4_ * auVar56._8_4_;
                    auVar145._12_4_ = tray.rdir.field_0._28_4_ * auVar56._12_4_;
                    auVar56 = vsubps_avx(auVar116,auVar17);
                    auVar154._0_4_ = tray.rdir.field_0._32_4_ * auVar56._0_4_;
                    auVar154._4_4_ = tray.rdir.field_0._36_4_ * auVar56._4_4_;
                    auVar154._8_4_ = tray.rdir.field_0._40_4_ * auVar56._8_4_;
                    auVar154._12_4_ = tray.rdir.field_0._44_4_ * auVar56._12_4_;
                    auVar56 = vpminsd_avx(auVar91,auVar133);
                    auVar65 = vpminsd_avx(auVar102,auVar145);
                    auVar56 = vpmaxsd_avx(auVar56,auVar65);
                    auVar65 = vpminsd_avx(auVar118,auVar154);
                    auVar56 = vpmaxsd_avx(auVar56,auVar65);
                    auVar72._0_4_ = auVar56._0_4_ * 0.99999964;
                    auVar72._4_4_ = auVar56._4_4_ * 0.99999964;
                    auVar72._8_4_ = auVar56._8_4_ * 0.99999964;
                    auVar72._12_4_ = auVar56._12_4_ * 0.99999964;
                    auVar56 = vpmaxsd_avx(auVar91,auVar133);
                    auVar65 = vpmaxsd_avx(auVar102,auVar145);
                    auVar65 = vpminsd_avx(auVar56,auVar65);
                    auVar56 = vpmaxsd_avx(auVar118,auVar154);
                    auVar65 = vpminsd_avx(auVar65,auVar56);
                    auVar56 = vpmaxsd_avx(auVar72,(undefined1  [16])tray.tnear.field_0);
                    auVar103._0_4_ = auVar65._0_4_ * 1.0000004;
                    auVar103._4_4_ = auVar65._4_4_ * 1.0000004;
                    auVar103._8_4_ = auVar65._8_4_ * 1.0000004;
                    auVar103._12_4_ = auVar65._12_4_ * 1.0000004;
                    auVar65 = vpminsd_avx(auVar103,(undefined1  [16])tray.tfar.field_0);
                    if ((uVar19 & 7) == 6) {
                      auVar56 = vcmpps_avx(auVar56,auVar65,2);
                      uVar23 = *(undefined4 *)(uVar21 + 0xe0 + uVar32 * 4);
                      auVar104._4_4_ = uVar23;
                      auVar104._0_4_ = uVar23;
                      auVar104._8_4_ = uVar23;
                      auVar104._12_4_ = uVar23;
                      auVar65 = vcmpps_avx(auVar104,auVar49,2);
                      uVar23 = *(undefined4 *)(uVar21 + 0xf0 + uVar32 * 4);
                      auVar119._4_4_ = uVar23;
                      auVar119._0_4_ = uVar23;
                      auVar119._8_4_ = uVar23;
                      auVar119._12_4_ = uVar23;
                      auVar49 = vcmpps_avx(auVar49,auVar119,1);
                      auVar49 = vandps_avx(auVar65,auVar49);
                      auVar49 = vandps_avx(auVar49,auVar56);
                    }
                    else {
                      auVar49 = vcmpps_avx(auVar56,auVar65,2);
                    }
                    auVar49 = vandps_avx(auVar49,auVar85);
                    auVar49 = vpslld_avx(auVar49,0x1f);
                    auVar60 = ZEXT1664(auVar49);
                    if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar49[0xf] < '\0') {
                      auVar49 = vblendvps_avx(auVar206._0_16_,auVar72,auVar49);
                      auVar60 = ZEXT1664(auVar49);
                      if (root.ptr != 8) {
                        pNVar33->ptr = root.ptr;
                        pNVar33 = pNVar33 + 1;
                        *paVar30 = auVar201._0_16_;
                        paVar30 = paVar30 + 1;
                      }
                      auVar201 = ZEXT1664(auVar49);
                      root.ptr = sVar4;
                    }
                  }
                } while ((sVar4 != 8) && (bVar34 = uVar32 < 3, uVar32 = uVar32 + 1, bVar34));
                iVar20 = 0;
                if (root.ptr == 8) {
LAB_0053eeb7:
                  bVar34 = false;
                  iVar20 = 4;
                }
                else {
                  auVar85 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar201._0_16_,6);
                  uVar23 = vmovmskps_avx(auVar85);
                  bVar34 = true;
                  if ((uint)POPCOUNT(uVar23) <= uVar29) {
                    pNVar33->ptr = root.ptr;
                    pNVar33 = pNVar33 + 1;
                    *paVar30 = auVar201._0_16_;
                    paVar30 = paVar30 + 1;
                    goto LAB_0053eeb7;
                  }
                }
              } while (bVar34);
            }
          }
        }
      } while (iVar20 != 3);
      auVar9 = vandps_avx(auVar9,(undefined1  [16])terminated.field_0);
      auVar59._8_4_ = 0xff800000;
      auVar59._0_8_ = 0xff800000ff800000;
      auVar59._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar59);
      *(undefined1 (*) [16])pRVar1 = auVar9;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }